

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::clearBadBasisChange(HEkk *this,BadBasisChangeReason reason)

{
  double dVar1;
  bool *pbVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  HighsInt HVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  pointer pHVar9;
  pointer pHVar10;
  pointer pHVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  pHVar10 = (this->bad_basis_change_).
            super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar9 = (this->bad_basis_change_).
           super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (reason == kAll) {
    if (pHVar9 == pHVar10) {
      return;
    }
    goto LAB_00339cf4;
  }
  uVar13 = (long)pHVar9 - (long)pHVar10;
  if (0 < (long)uVar13 >> 7) {
    uVar14 = uVar13 & 0xffffffffffffff80;
    pbVar2 = &pHVar10->taboo;
    lVar12 = ((long)uVar13 >> 7) + 1;
    pHVar10 = pHVar10 + 2;
    do {
      if (pHVar10[-2].reason == reason) {
        pHVar10 = pHVar10 + -2;
        goto LAB_00339cad;
      }
      if (pHVar10[-1].reason == reason) {
        pHVar10 = pHVar10 + -1;
        goto LAB_00339cad;
      }
      if (pHVar10->reason == reason) goto LAB_00339cad;
      if (pHVar10[1].reason == reason) {
        pHVar10 = pHVar10 + 1;
        goto LAB_00339cad;
      }
      lVar12 = lVar12 + -1;
      pHVar10 = pHVar10 + 4;
    } while (1 < lVar12);
    uVar13 = (long)pHVar9 - (long)(pbVar2 + uVar14);
    pHVar10 = (pointer)(pbVar2 + uVar14);
  }
  lVar12 = (long)uVar13 >> 5;
  if (lVar12 == 1) {
LAB_00339c91:
    if (pHVar10->reason != reason) {
      pHVar10 = pHVar9;
    }
  }
  else if (lVar12 == 2) {
LAB_00339c88:
    if (pHVar10->reason != reason) {
      pHVar10 = pHVar10 + 1;
      goto LAB_00339c91;
    }
  }
  else {
    if (lVar12 != 3) {
      return;
    }
    if (pHVar10->reason != reason) {
      pHVar10 = pHVar10 + 1;
      goto LAB_00339c88;
    }
  }
LAB_00339cad:
  pHVar11 = pHVar10 + 1;
  if (pHVar11 != pHVar9 && pHVar10 != pHVar9) {
    do {
      if (pHVar11->reason != reason) {
        bVar4 = pHVar11->taboo;
        uVar5 = *(undefined3 *)&pHVar11->field_0x1;
        HVar6 = pHVar11->row_out;
        HVar7 = pHVar11->variable_out;
        HVar8 = pHVar11->variable_in;
        uVar3 = *(undefined4 *)&pHVar11->field_0x14;
        dVar1 = pHVar11->save_value;
        pHVar10->reason = pHVar11->reason;
        *(undefined4 *)&pHVar10->field_0x14 = uVar3;
        pHVar10->save_value = dVar1;
        pHVar10->taboo = bVar4;
        *(undefined3 *)&pHVar10->field_0x1 = uVar5;
        pHVar10->row_out = HVar6;
        pHVar10->variable_out = HVar7;
        pHVar10->variable_in = HVar8;
        pHVar10 = pHVar10 + 1;
      }
      pHVar11 = pHVar11 + 1;
    } while (pHVar11 != pHVar9);
    pHVar9 = (this->bad_basis_change_).
             super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pHVar10 == pHVar9) {
    return;
  }
LAB_00339cf4:
  (this->bad_basis_change_).
  super__Vector_base<HighsSimplexBadBasisChangeRecord,_std::allocator<HighsSimplexBadBasisChangeRecord>_>
  ._M_impl.super__Vector_impl_data._M_finish = pHVar10;
  return;
}

Assistant:

void HEkk::clearBadBasisChange(const BadBasisChangeReason reason) {
  if (reason == BadBasisChangeReason::kAll) {
    bad_basis_change_.clear();
  } else {
    bad_basis_change_.erase(
        std::remove_if(
            bad_basis_change_.begin(), bad_basis_change_.end(),
            [reason](const HighsSimplexBadBasisChangeRecord& record) {
              return record.reason == reason;
            }),
        bad_basis_change_.end());
  }
}